

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void cutworm(monst *worm,xchar x,xchar y,obj *weap)

{
  wseg *tail;
  uchar uVar1;
  uint wnum_00;
  int iVar2;
  int iVar3;
  monst *worm_00;
  char *pcVar4;
  bool bVar5;
  int local_40;
  int new_wnum;
  int cut_chance;
  int wnum;
  monst *new_worm;
  wseg *new_tail;
  wseg *curr;
  obj *weap_local;
  xchar y_local;
  xchar x_local;
  monst *worm_local;
  
  wnum_00 = (uint)worm->wormno;
  if ((wnum_00 != 0) && ((x != worm->mx || (y != worm->my)))) {
    local_40 = rnd(0x14);
    if ((weap != (obj *)0x0) &&
       (((weap->oclass == '\x02' && ('\0' < objects[weap->otyp].oc_subtyp)) &&
        (objects[weap->otyp].oc_subtyp < '\v')))) {
      local_40 = local_40 + 10;
    }
    if (0x10 < local_40) {
      new_tail = level->wtails[(int)wnum_00];
      do {
        bVar5 = true;
        if (new_tail->wx == x) {
          bVar5 = new_tail->wy != y;
        }
        if (!bVar5) {
          if (new_tail == level->wtails[(int)wnum_00]) {
            shrink_worm(wnum_00);
            return;
          }
          tail = level->wtails[(int)wnum_00];
          level->wtails[(int)wnum_00] = new_tail->nseg;
          new_tail->nseg = (wseg *)0x0;
          iVar2 = rn2(3);
          if ((iVar2 != 0) || (iVar2 = get_wormno(level), iVar2 == 0)) {
            cutoff(worm,tail);
            return;
          }
          remove_monster(level,(int)x,(int)y);
          worm_00 = clone_mon(worm,x,y);
          if (worm_00 == (monst *)0x0) {
            cutoff(worm,tail);
            return;
          }
          worm_00->wormno = (uchar)iVar2;
          if (worm->m_lev < 4) {
            uVar1 = worm->m_lev;
          }
          else if (worm->m_lev - 2 < 4) {
            uVar1 = '\x03';
          }
          else {
            uVar1 = worm->m_lev + 0xfe;
          }
          worm->m_lev = uVar1;
          worm_00->m_lev = worm->m_lev;
          iVar3 = dice((uint)worm_00->m_lev,8);
          worm_00->mhp = iVar3;
          worm_00->mhpmax = iVar3;
          if (3 < worm->m_lev) {
            iVar3 = dice((uint)worm->m_lev,8);
            worm->mhpmax = iVar3;
            if (worm->mhpmax < worm->mhp) {
              worm->mhp = worm->mhpmax;
            }
          }
          level->wtails[iVar2] = tail;
          level->wheads[iVar2] = new_tail;
          level->wgrowtime[iVar2] = 0;
          place_wsegs(worm_00);
          if (flags.mon_moving != '\0') {
            pcVar4 = Monnam(worm);
            pline("%s is cut in half.",pcVar4);
            return;
          }
          pcVar4 = mon_nam(worm);
          pline("You cut %s in half.",pcVar4);
          return;
        }
        new_tail = new_tail->nseg;
      } while (new_tail != (wseg *)0x0);
      warning("cutworm: no segment at (%d,%d)",(ulong)(uint)(int)x,(ulong)(uint)(int)y);
    }
  }
  return;
}

Assistant:

void cutworm(struct monst *worm, xchar x, xchar y, struct obj *weap)
{
    struct wseg  *curr, *new_tail;
    struct monst *new_worm;
    int wnum = worm->wormno;
    int cut_chance, new_wnum;

    if (!wnum) return;	/* no worm */

    if (x == worm->mx && y == worm->my) return;		/* hit on head */

    /* cutting goes best with a bladed weapon */
    cut_chance = rnd(20);	/* Normally  1-16 does not cut */
				/* Normally 17-20 does */

    if (weap && is_blade(weap))	/* With a blade 1- 6 does not cut */
	cut_chance += 10;	/*		7-20 does */

    if (cut_chance < 17) return;	/* not good enough */

    /* Find the segment that was attacked. */
    curr = level->wtails[wnum];

    while ( (curr->wx != x) || (curr->wy != y) ) {
	curr = curr->nseg;
	if (!curr) {
	    warning("cutworm: no segment at (%d,%d)", x, y);
	    return;
	}
    }

    /* If this is the tail segment, then the worm just loses it. */
    if (curr == level->wtails[wnum]) {
	shrink_worm(wnum);
	return;
    }

    /*
     *  Split the worm.  The tail for the new worm is the old worm's tail.
     *  The tail for the old worm is the segment that follows "curr",
     *  and "curr" becomes the dummy segment under the new head.
     */
    new_tail = level->wtails[wnum];
    level->wtails[wnum] = curr->nseg;
    curr->nseg = NULL;	/* split the worm */

    /*
     *  At this point, the old worm is correct.  Any new worm will have
     *  it's head at "curr" and its tail at "new_tail".
     */

    /* Sometimes the tail end dies. */
    if (rn2(3) || !(new_wnum = get_wormno(level))) {
	cutoff(worm, new_tail);
	return;
    }

    remove_monster(level, x, y);		/* clone_mon puts new head here */
    if (!(new_worm = clone_mon(worm, x, y))) {
	cutoff(worm, new_tail);
	return;
    }
    new_worm->wormno = new_wnum;	/* affix new worm number */

    /* Devalue the monster level of both halves of the worm. */
    worm->m_lev = ((unsigned)worm->m_lev <= 3) ?
		   (unsigned)worm->m_lev : max((unsigned)worm->m_lev - 2, 3);
    new_worm->m_lev = worm->m_lev;

    /* Calculate the mhp on the new_worm for the (lower) monster level. */
    new_worm->mhpmax = new_worm->mhp = dice((int)new_worm->m_lev, 8);

    /* Calculate the mhp on the old worm for the (lower) monster level. */
    if (worm->m_lev > 3) {
	worm->mhpmax = dice((int)worm->m_lev, 8);
	if (worm->mhpmax < worm->mhp) worm->mhp = worm->mhpmax;
    }

    level->wtails[new_wnum] = new_tail;	/* We've got all the info right now */
    level->wheads[new_wnum] = curr;	/* so we can do this faster than    */
    level->wgrowtime[new_wnum] = 0L;	/* trying to call initworm().       */

    /* Place the new monster at all the segment locations. */
    place_wsegs(new_worm);

    if (flags.mon_moving)
	pline("%s is cut in half.", Monnam(worm));
    else
	pline("You cut %s in half.", mon_nam(worm));
}